

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O1

int buffer_read_fn(spng_ctx *ctx,void *user,void *data,size_t n)

{
  int iVar1;
  
  iVar1 = -1;
  if (n <= ctx->bytes_left) {
    ctx->data = ctx->data + ctx->last_read_size;
    ctx->last_read_size = n;
    ctx->bytes_left = ctx->bytes_left - n;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int buffer_read_fn(spng_ctx *ctx, void *user, void *data, size_t n)
{
    if(n > ctx->bytes_left) return SPNG_IO_EOF;

    (void)user;
    (void)data;
    ctx->data = ctx->data + ctx->last_read_size;

    ctx->last_read_size = n;
    ctx->bytes_left -= n;

    return 0;
}